

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O2

void __thiscall xray_re::mp_rpoint_io::operator()(mp_rpoint_io *this,mp_rpoint *rpoint,xr_writer *w)

{
  uint8_t local_1c;
  uint8_t local_1b;
  uint8_t local_1a [2];
  
  xr_writer::w_fvector3(w,&rpoint->p);
  xr_writer::w_fvector3(w,&rpoint->a);
  local_1c = rpoint->team;
  (*w->_vptr_xr_writer[2])(w,&local_1c,1);
  local_1b = rpoint->respawn;
  (*w->_vptr_xr_writer[2])(w,&local_1b,1);
  local_1a[0] = rpoint->game;
  (*w->_vptr_xr_writer[2])(w,local_1a,1);
  local_1a[1] = 0;
  (*w->_vptr_xr_writer[2])(w,local_1a + 1,1);
  return;
}

Assistant:

void mp_rpoint_io::operator()(const mp_rpoint* rpoint, xr_writer& w) const {
	w.w_fvector3(rpoint->p);
	w.w_fvector3(rpoint->a);
	w.w_u8(rpoint->team);
	w.w_u8(rpoint->respawn);
	w.w_u8(rpoint->game);
	w.w_u8(0);
}